

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

void textui_textblock_place(textblock *tb,region_conflict orig_area,char *header)

{
  size_t sVar1;
  wchar_t *text;
  uint8_t *attrs;
  wchar_t y;
  wchar_t wVar2;
  ulong n_lines;
  region_conflict rVar3;
  size_t *line_lengths;
  size_t *line_starts;
  region_conflict area;
  
  rVar3 = region_calculate(orig_area);
  line_starts = (size_t *)0x0;
  line_lengths = (size_t *)0x0;
  area = rVar3;
  sVar1 = textblock_calculate_lines(tb,&line_starts,&line_lengths,(long)rVar3.width);
  wVar2 = rVar3.page_rows;
  if (header != (char *)0x0) {
    wVar2 = wVar2 + L'\xffffffff';
    area.page_rows = wVar2;
    y = rVar3.row;
    Term_erase(rVar3.col,y,rVar3.width);
    c_put_str('\x0e',header,y,rVar3.col);
    area.row = y + L'\x01';
  }
  n_lines = (long)wVar2;
  if (sVar1 < (ulong)(long)wVar2) {
    n_lines = sVar1;
  }
  text = textblock_text(tb);
  attrs = textblock_attrs(tb);
  display_area(text,attrs,line_starts,line_lengths,n_lines,area,0);
  mem_free(line_starts);
  mem_free(line_lengths);
  return;
}

Assistant:

void textui_textblock_place(textblock *tb, region orig_area, const char *header)
{
	/* xxx on resize this should be recalculated */
	region area = region_calculate(orig_area);

	size_t *line_starts = NULL, *line_lengths = NULL;
	size_t n_lines;

	n_lines = textblock_calculate_lines(tb,
			&line_starts, &line_lengths, area.width);

	if (header != NULL) {
		area.page_rows--;
		Term_erase(area.col, area.row, area.width);
		c_put_str(COLOUR_L_BLUE, header, area.row, area.col);
		area.row++;
	}

	if (n_lines > (size_t) area.page_rows)
		n_lines = area.page_rows;

	display_area(textblock_text(tb), textblock_attrs(tb), line_starts,
	             line_lengths, n_lines, area, 0);

	mem_free(line_starts);
	mem_free(line_lengths);
}